

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O1

int __thiscall ComplexType::serialise(ComplexType *this,uint8_t *buf,size_t max_len)

{
  pointer psVar1;
  element_type *peVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  shared_ptr<BER_CONTAINER> *item;
  pointer psVar8;
  uint uVar9;
  ulong uVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  bool bVar13;
  bool bVar14;
  
  uVar9 = 0xffffffe1;
  if (1 < max_len) {
    *buf = (char)(this->super_BER_CONTAINER)._type;
    uVar9 = 1;
    puVar11 = buf + 2;
    psVar8 = (this->values).
             super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->values).
             super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar13 = psVar8 == psVar1;
    if (bVar13) {
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      puVar12 = puVar11;
      do {
        peVar2 = (psVar8->super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (peVar2 == (element_type *)0x0) {
          uVar9 = 0xffffffe0;
          bVar14 = false;
        }
        else {
          uVar3 = (*peVar2->_vptr_BER_CONTAINER[2])(peVar2,puVar12,(long)(int)~uVar4 + max_len);
          bVar14 = -1 < (int)uVar3;
          uVar6 = 0;
          if (bVar14) {
            uVar6 = (ulong)uVar3;
            uVar3 = uVar9;
          }
          uVar9 = uVar3;
          puVar12 = puVar12 + uVar6;
          uVar4 = (int)uVar6 + uVar4;
        }
        if (!bVar14) break;
        psVar8 = psVar8 + 1;
        bVar13 = psVar8 == psVar1;
      } while (!bVar13);
    }
    if (bVar13) {
      lVar7 = 1;
      if (0x7f < uVar4) {
        lVar7 = 3 - (ulong)(uVar4 < 0x101);
      }
      uVar9 = 0xffffffe1;
      if ((ulong)uVar4 + 1 + lVar7 <= max_len) {
        if ((0x7f < uVar4) && (-1 < (int)(uVar4 - 1))) {
          iVar5 = (int)lVar7 + uVar4 + -2;
          uVar6 = (ulong)(uVar4 - 1);
          do {
            uVar10 = uVar6 - 1;
            puVar11[iVar5] = buf[uVar6 + 2];
            iVar5 = iVar5 + -1;
            uVar6 = uVar10;
          } while (-1 < (int)uVar10);
        }
        puVar12 = buf + 1;
        iVar5 = 1;
        if (0x7f < uVar4) {
          if (uVar4 < 0x101) {
            *puVar12 = 0x81;
            iVar5 = 2;
            puVar12 = puVar11;
          }
          else {
            *puVar12 = 0x82;
            buf[2] = (uint8_t)(uVar4 >> 8);
            puVar12 = buf + 3;
            iVar5 = 3;
          }
        }
        *puVar12 = (uint8_t)uVar4;
        uVar9 = uVar4 + 1 + iVar5;
      }
    }
  }
  return uVar9;
}

Assistant:

int ComplexType::serialise(uint8_t* buf, size_t max_len){
    int i = BER_CONTAINER::serialise(buf, max_len);
    CHECK_ENCODE_ERR(i);

    uint8_t* ptr = buf + i;
    uint8_t* len_ptr = ptr++;

    uint8_t* internalPtr = ptr; // This is V*

    int internalLength = 0;

    for(const auto& item : values){
        if(!item) return SNMP_BUFFER_ENCODE_ERROR_INVALID_ITEM;
        int length = item->serialise(internalPtr, max_len - internalLength - 1);
        if(length < 0){
            SNMP_LOGD("Item failed to serialiseInto: %d, reason: %d\n", item->_type, length);
            CHECK_ENCODE_ERR(length);
        }
        internalPtr += length;
        internalLength += length;
    }

    int num_length_bytes = encode_ber_length_integer_count(internalLength);
    if(max_len < (size_t)i + internalLength + num_length_bytes) return SNMP_BUFFER_ENCODE_ERR_LEN_EXCEEDED;
    if(num_length_bytes > 1){
        shift_arr_right(ptr, num_length_bytes-1, internalLength);
    }

    // then write the length value
    i += encode_ber_length_integer(len_ptr, internalLength, num_length_bytes); // , max_len_bytes just to be safe
    return internalLength + i;
}